

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.test.cpp
# Opt level: O1

void testRgbToHsv(Vector3f *rgb)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  ostream *poVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector3f VVar11;
  Vector3f local_98;
  float local_88 [4];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fVar6 = rgb->x;
  fVar7 = rgb->y;
  fVar10 = rgb->z;
  fVar9 = fVar7;
  fVar3 = fVar10;
  if (fVar10 <= fVar7) {
    fVar9 = fVar10;
    fVar3 = fVar7;
  }
  fVar8 = (float)(-(uint)(fVar7 < fVar10) & 0xbf800000);
  fVar10 = fVar6;
  fVar7 = fVar3;
  if (fVar3 <= fVar6) {
    fVar10 = fVar3;
    fVar7 = fVar6;
  }
  fVar5 = fVar10;
  if (fVar9 <= fVar10) {
    fVar5 = fVar9;
  }
  fVar10 = ABS((fVar10 - fVar9) / ((fVar7 - fVar5) * 6.0 + 1e-20) +
               (float)(-(uint)(fVar6 < fVar3) & (uint)(-0.33333334 - fVar8) |
                      ~-(uint)(fVar6 < fVar3) & (uint)fVar8));
  local_78 = ZEXT416((uint)fVar7);
  fVar6 = (fVar7 - fVar5) / (fVar7 + 1e-20);
  local_68 = ZEXT416((uint)fVar6);
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  ImGui::ColorConvertHSVtoRGB(fVar10,fVar6,fVar7,local_88,local_88 + 1,local_88 + 2);
  local_98 = convertRgbToHsv(rgb);
  fVar7 = local_98.z;
  VVar11 = convertHsvToRgb(&local_98);
  uVar1 = rgb->x;
  uVar2 = rgb->y;
  local_58 = ZEXT416((uint)(ABS(rgb->z - local_88[2]) +
                           ABS((float)uVar2 - SUB84(local_88._0_8_,4)) +
                           ABS((float)uVar1 - (float)local_88._0_8_)));
  local_48 = ZEXT416((uint)(ABS(rgb->z - VVar11.z) +
                           ABS((float)uVar2 - VVar11.y) + ABS((float)uVar1 - VVar11.x)));
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rgb(",4);
  *(undefined8 *)(std::ostream::_M_insert<double> + *(long *)(std::cout + -0x18)) = 0xd;
  poVar4 = std::ostream::_M_insert<double>((double)rgb->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xd;
  poVar4 = std::ostream::_M_insert<double>((double)rgb->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xd;
  poVar4 = std::ostream::_M_insert<double>((double)rgb->z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") -> hsv(",9);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xd;
  poVar4 = std::ostream::_M_insert<double>((double)fVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xd;
  poVar4 = std::ostream::_M_insert<double>((double)(float)local_68._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xd;
  poVar4 = std::ostream::_M_insert<double>((double)(float)local_78._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"), err = ",9);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xd;
  poVar4 = std::ostream::_M_insert<double>((double)(float)local_58._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", myErr = ",10);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xd;
  poVar4 = std::ostream::_M_insert<double>((double)(float)local_48._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  fVar6 = local_98.x;
  if (ABS(fVar10 - local_98.x) < 1e-06) {
    if ((ABS((float)local_68._0_4_ - local_98.y) < 1e-06) &&
       (ABS((float)local_78._0_4_ - fVar7) < 1e-06)) {
      return;
    }
  }
  *(undefined8 *)(std::ostream::_M_insert<double> + *(long *)(std::cout + -0x18)) = 0x38;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MISMATCH: got myHsv(",0x14);
  *(undefined8 *)(std::ostream::_M_insert<double> + *(long *)(std::cout + -0x18)) = 0xd;
  poVar4 = std::ostream::_M_insert<double>((double)fVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xd;
  poVar4 = std::ostream::_M_insert<double>((double)local_98.y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xd;
  poVar4 = std::ostream::_M_insert<double>((double)fVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
  return;
}

Assistant:

void testRgbToHsv(const sf::Vector3f& rgb) {
    sf::Vector3f hsv;
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, hsv.x, hsv.y, hsv.z);
    sf::Vector3f rgb2;
    ImGui::ColorConvertHSVtoRGB(hsv.x, hsv.y, hsv.z, rgb2.x, rgb2.y, rgb2.z);

    sf::Vector3f myHsv = convertRgbToHsv(rgb);
    sf::Vector3f myRgb2 = convertHsvToRgb(myHsv);

    float err = findTotalError(rgb, rgb2);
    float myErr = findTotalError(rgb, myRgb2);

    std::cout << std::setprecision(10);
    std::cout << "rgb(" << std::setw(13) << rgb.x << ", " << std::setw(13) << rgb.y << ", " << std::setw(13) << rgb.z
        << ") -> hsv(" << std::setw(13) << hsv.x << ", " << std::setw(13) << hsv.y << ", " << std::setw(13) << hsv.z
        << "), err = " << std::setw(13) << err << ", myErr = " << std::setw(13) << myErr << "\n";

    if (floatEqual(hsv.x, myHsv.x) && floatEqual(hsv.y, myHsv.y) && floatEqual(hsv.z, myHsv.z)) {
    } else {
        std::cout << std::setw(56) << "MISMATCH: got myHsv(" << std::setw(13) << myHsv.x << ", " << std::setw(13) << myHsv.y << ", " << std::setw(13) << myHsv.z << ")\n";
        assert(false);
    }
    assert(floatEqual(err, 0.0f));
    assert(floatEqual(myErr, 0.0f));
}